

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmtable.cpp
# Opt level: O2

UFormattable * ufmt_getArrayItemByIndex_63(UFormattable *fmt,int32_t n,UErrorCode *status)

{
  if (*(int *)(fmt + 5) == 4) {
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((-1 < n) && (n < *(int *)(fmt + 2))) {
        return (UFormattable *)((ulong)(uint)n * 0x70 + (long)fmt[1]);
      }
      *status = U_INDEX_OUTOFBOUNDS_ERROR;
    }
  }
  else if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    *status = U_INVALID_FORMAT_ERROR;
  }
  return (UFormattable *)0x0;
}

Assistant:

const Formattable* 
Formattable::getArray(int32_t& count, UErrorCode& status) const 
{
    if (fType != kArray) {
        setError(status, U_INVALID_FORMAT_ERROR);
        count = 0;
        return NULL;
    }
    count = fValue.fArrayAndCount.fCount; 
    return fValue.fArrayAndCount.fArray;
}